

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

Reference __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::DoReadReference(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *this)

{
  int iVar1;
  ExprBase EVar2;
  undefined8 *in_RDI;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  *unaff_retaddr;
  int index;
  NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *in_stack_ffffffffffffffd8;
  undefined8 in_stack_fffffffffffffff8;
  
  iVar1 = ReadUInt(unaff_retaddr,(uint)((ulong)in_stack_fffffffffffffff8 >> 0x20));
  BinaryReaderBase::ReadTillEndOfLine((BinaryReaderBase *)*in_RDI);
  if (iVar1 < *(int *)in_RDI[1]) {
    EVar2.impl_ = (Impl *)NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::
                          OnVariableRef(in_stack_ffffffffffffffd8,0);
  }
  else {
    EVar2.impl_ = (Impl *)NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::
                          OnCommonExprRef(in_stack_ffffffffffffffd8,0);
  }
  return (Reference)EVar2.impl_;
}

Assistant:

Reference DoReadReference() {
    int index = ReadUInt(num_vars_and_exprs_);
    reader_.ReadTillEndOfLine();
    return index < header_.num_vars ?
          handler_.OnVariableRef(index) :
          handler_.OnCommonExprRef(index - header_.num_vars);
  }